

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrCol3f
          (X3DImporter *this,int pAttrIdx,vector<aiColor3D,_std::allocator<aiColor3D>_> *pValue)

{
  _List_node_base *p_Var1;
  list<aiColor3D,_std::allocator<aiColor3D>_> tlist;
  _List_base<aiColor3D,_std::allocator<aiColor3D>_> local_30;
  
  local_30._M_impl._M_node._M_size = 0;
  local_30._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_30;
  local_30._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_30;
  XML_ReadNode_GetAttrVal_AsListCol3f
            (this,pAttrIdx,(list<aiColor3D,_std::allocator<aiColor3D>_> *)&local_30);
  if (local_30._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_30) {
    std::vector<aiColor3D,_std::allocator<aiColor3D>_>::reserve
              (pValue,local_30._M_impl._M_node._M_size);
    p_Var1 = (_List_node_base *)&local_30;
    while (p_Var1 = (((_List_base<aiColor3D,_std::allocator<aiColor3D>_> *)&p_Var1->_M_next)->
                    _M_impl)._M_node.super__List_node_base._M_next,
          p_Var1 != (_List_node_base *)&local_30) {
      std::vector<aiColor3D,_std::allocator<aiColor3D>_>::push_back
                (pValue,(value_type *)(p_Var1 + 1));
    }
  }
  std::__cxx11::_List_base<aiColor3D,_std::allocator<aiColor3D>_>::_M_clear(&local_30);
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrCol3f(const int pAttrIdx, std::vector<aiColor3D>& pValue)
{
    std::list<aiColor3D> tlist;

	XML_ReadNode_GetAttrVal_AsListCol3f(pAttrIdx, tlist);// read as list
	// and copy to array
	if(!tlist.empty())
	{
		pValue.reserve(tlist.size());
		for(std::list<aiColor3D>::iterator it = tlist.begin(); it != tlist.end(); ++it) pValue.push_back(*it);
	}
}